

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_int rf_get_ktx_image_size(void *src,rf_int src_size)

{
  _Bool _Var1;
  undefined1 local_5c;
  char acStack_5b [7];
  rf_ktx_header header;
  int result;
  rf_int src_size_local;
  void *src_local;
  
  header.mipmap_levels = 0;
  if ((src != (void *)0x0) && (0x3f < (ulong)src_size)) {
    unique0x1000006d = src_size;
    memcpy(&local_5c,src,0x40);
    register0x00000000 = stack0xffffffffffffffe8 - ((ulong)header.faces + 0x40);
    _Var1 = rf_match_str_cstr(acStack_5b,6,"KTX 11");
    if ((_Var1) && (4 < stack0xffffffffffffffe8)) {
      header.mipmap_levels = *(uint *)((long)src + (ulong)header.faces + 0x40);
    }
  }
  return (long)(int)header.mipmap_levels;
}

Assistant:

RF_API rf_int rf_get_ktx_image_size(const void* src, rf_int src_size)
{
    int result = 0;

    if (src && src_size >= sizeof(rf_ktx_header))
    {
        rf_ktx_header header = *(rf_ktx_header*)src;
        src = (char*)src + sizeof(rf_ktx_header) + header.key_value_data_size;
        src_size -= sizeof(rf_ktx_header) + header.key_value_data_size;

        if (rf_match_str_cstr(header.id + 1, 6, "KTX 11"))
        {
            if (src_size > sizeof(unsigned int))
            {
                memcpy(&result, src, sizeof(unsigned int));
            }
        }
    }

    return result;
}